

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O1

Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::writeTarget
          (DeferredThirdPartyClient *this,Builder target)

{
  RpcConnectionState *pRVar1;
  RpcClient *result;
  ClientHook *pCVar2;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  DeferredThirdPartyClient *in_RSI;
  ClientHook *pCVar3;
  Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_> MVar4;
  _func_int **local_20;
  void *local_18;
  
  pRVar1 = (in_RSI->super_RpcClient).connectionState.ptr;
  pCVar2 = ensureAccepted(in_RSI);
  if (((RpcSystemBrand *)pCVar2->brand != (pRVar1->brand).ptr) ||
     (pCVar3 = pCVar2, (RpcConnectionState *)pCVar2[2].brand != pRVar1)) {
    pCVar3 = (ClientHook *)0x0;
  }
  if (pCVar3 == (ClientHook *)0x0) {
    (*pCVar2->_vptr_ClientHook[4])(&local_20,pCVar2);
    (this->super_RpcClient).super_ClientHook._vptr_ClientHook = local_20;
    (this->super_RpcClient).super_ClientHook.brand = local_18;
    pCVar2 = extraout_RDX_00;
  }
  else {
    (*pCVar3->_vptr_ClientHook[10])(this);
    pCVar2 = extraout_RDX;
  }
  MVar4.ptr.ptr = pCVar2;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<capnp::ClientHook,_std::nullptr_t>_>)MVar4.ptr;
}

Assistant:

kj::Maybe<kj::Own<ClientHook>> writeTarget(
        rpc::MessageTarget::Builder target) override {
      // Someone is addressing a message to this capability. We probably need to accept it and
      // have them address the accepted capability instead.
      return connectionState->writeTarget(ensureAccepted(), target);
    }